

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.cpp
# Opt level: O2

pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> * __thiscall
embree::sse2::GridSOA::buildMSMBlurBVH
          (pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> *__return_storage_ptr__,
          GridSOA *this,range<int> *time_range,size_t *allocator,BBox3fa *bounds_o)

{
  BBox3fa *pBVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  size_t i;
  long lVar7;
  ulong uVar8;
  Vec3fa *pVVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  size_t sVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> *root_bounds;
  char *pcVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar22;
  float fVar23;
  undefined1 auVar21 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar31;
  float fVar32;
  undefined1 auVar30 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  uint local_b4;
  range<int> local_a8;
  GridSOA *local_a0;
  range<int> *local_98;
  size_t *local_90;
  GridRange range;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  sVar13 = (size_t)time_range->_begin;
  if (time_range->_end - time_range->_begin == 1) {
    range.u_end = this->width - 1;
    range.v_end = this->height - 1;
    range.u_start = 0;
    range.v_start = 0;
    buildMBlurBVH(__return_storage_ptr__,this,sVar13,&range,allocator);
    *(size_t *)(this->data + (ulong)this->rootOffset + sVar13 * 8) =
         (__return_storage_ptr__->first).ptr;
    uVar4 = *(undefined8 *)((long)&(__return_storage_ptr__->second).bounds0.lower.field_0 + 8);
    *(undefined8 *)&bounds_o[sVar13].lower.field_0 =
         *(undefined8 *)&(__return_storage_ptr__->second).bounds0.lower.field_0;
    *(undefined8 *)((long)&bounds_o[sVar13].lower.field_0 + 8) = uVar4;
    uVar4 = *(undefined8 *)((long)&(__return_storage_ptr__->second).bounds0.upper.field_0 + 8);
    *(undefined8 *)&bounds_o[sVar13].upper.field_0 =
         *(undefined8 *)&(__return_storage_ptr__->second).bounds0.upper.field_0;
    *(undefined8 *)((long)&bounds_o[sVar13].upper.field_0 + 8) = uVar4;
    uVar4 = *(undefined8 *)((long)&(__return_storage_ptr__->second).bounds1.lower.field_0 + 8);
    *(undefined8 *)&bounds_o[sVar13 + 1].lower.field_0 =
         *(undefined8 *)&(__return_storage_ptr__->second).bounds1.lower.field_0;
    *(undefined8 *)((long)&bounds_o[sVar13 + 1].lower.field_0 + 8) = uVar4;
    uVar4 = *(undefined8 *)((long)&(__return_storage_ptr__->second).bounds1.upper.field_0 + 8);
    *(undefined8 *)&bounds_o[sVar13 + 1].upper.field_0 =
         *(undefined8 *)&(__return_storage_ptr__->second).bounds1.upper.field_0;
    *(undefined8 *)((long)&bounds_o[sVar13 + 1].upper.field_0 + 8) = uVar4;
    return __return_storage_ptr__;
  }
  sVar13 = *allocator;
  pcVar17 = this->data + sVar13;
  *allocator = sVar13 + 0x100;
  *(undefined8 *)(this[4].data + sVar13) = 0x7f8000007f800000;
  *(undefined8 *)(this[5].data + (sVar13 - 0x30)) = 0x7f8000007f800000;
  *(undefined8 *)(this[5].data + (sVar13 - 0x28)) = 0xff800000ff800000;
  *(undefined8 *)(this[5].data + (sVar13 - 0x20)) = 0xff800000ff800000;
  *(undefined8 *)(this[2].data + (sVar13 - 0x10)) = 0x7f8000007f800000;
  *(undefined8 *)(this[2].data + (sVar13 - 8)) = 0x7f8000007f800000;
  *(undefined8 *)(this[2].data + (sVar13 - 0x30)) = 0x7f8000007f800000;
  *(undefined8 *)(this[2].data + (sVar13 - 0x28)) = 0x7f8000007f800000;
  *(undefined8 *)(this[1].data + (sVar13 - 0x18)) = 0x7f8000007f800000;
  *(undefined8 *)(this[1].data + (sVar13 - 0x10)) = 0x7f8000007f800000;
  *(undefined8 *)(this[2].data + sVar13) = 0xff800000ff800000;
  *(undefined8 *)(this[3].data + (sVar13 - 0x30)) = 0xff800000ff800000;
  *(undefined8 *)(this[2].data + (sVar13 - 0x20)) = 0xff800000ff800000;
  *(undefined8 *)(this[2].data + (sVar13 - 0x18)) = 0xff800000ff800000;
  *(undefined8 *)(this[1].data + (sVar13 - 8)) = 0xff800000ff800000;
  *(undefined8 *)(this[1].data + sVar13) = 0xff800000ff800000;
  *(undefined8 *)(this[3].data + (sVar13 - 0x28)) = 0;
  *(undefined8 *)(this[3].data + (sVar13 - 0x20)) = 0;
  *(undefined8 *)(this[3].data + (sVar13 - 0x18)) = 0;
  *(undefined8 *)(this[3].data + (sVar13 - 0x10)) = 0;
  *(undefined8 *)(this[3].data + (sVar13 - 8)) = 0;
  *(undefined8 *)(this[3].data + sVar13) = 0;
  *(undefined8 *)(this[4].data + (sVar13 - 0x30)) = 0;
  *(undefined8 *)(this[4].data + (sVar13 - 0x28)) = 0;
  *(undefined8 *)(this[4].data + (sVar13 - 0x20)) = 0;
  *(undefined8 *)(this[4].data + (sVar13 - 0x18)) = 0;
  *(undefined8 *)(this[4].data + (sVar13 - 0x10)) = 0;
  *(undefined8 *)(this[4].data + (sVar13 - 8)) = 0;
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    *(undefined8 *)(pcVar17 + lVar7 * 8) = 8;
  }
  iVar16 = 0;
  local_b4 = 0;
  local_a0 = this;
  local_98 = time_range;
  local_90 = allocator;
  do {
    iVar2 = local_98->_begin;
    lVar7 = (long)iVar2;
    iVar3 = local_98->_end;
    lVar14 = (long)iVar3;
    iVar15 = iVar3 - iVar2;
    iVar10 = (iVar16 + 1) * iVar15;
    iVar5 = iVar16 * iVar15;
    do {
      iVar16 = iVar16 + 1;
      if (iVar16 == 5) {
        pBVar1 = bounds_o + lVar7;
        fVar18 = (pBVar1->lower).field_0.m128[0];
        fVar19 = (pBVar1->lower).field_0.m128[1];
        fVar34 = (pBVar1->lower).field_0.m128[2];
        fVar38 = (pBVar1->lower).field_0.m128[3];
        pVVar9 = &bounds_o[lVar7].upper;
        fVar20 = (pVVar9->field_0).m128[0];
        fVar22 = (pVVar9->field_0).m128[1];
        fVar23 = (pVVar9->field_0).m128[2];
        fVar24 = (pVVar9->field_0).m128[3];
        pBVar1 = bounds_o + lVar14;
        fVar41 = (pBVar1->lower).field_0.m128[0];
        fVar29 = (pBVar1->lower).field_0.m128[1];
        fVar31 = (pBVar1->lower).field_0.m128[2];
        fVar32 = (pBVar1->lower).field_0.m128[3];
        pVVar9 = &bounds_o[lVar14].upper;
        fVar25 = (pVVar9->field_0).m128[0];
        fVar26 = (pVVar9->field_0).m128[1];
        fVar27 = (pVVar9->field_0).m128[2];
        fVar28 = (pVVar9->field_0).m128[3];
        if (iVar3 - iVar2 != 1) {
          pVVar9 = &bounds_o[lVar7 + 1].upper;
          for (lVar11 = 1; lVar7 + lVar11 < lVar14; lVar11 = lVar11 + 1) {
            fVar33 = (float)(int)lVar11 / (float)(iVar3 - iVar2);
            fVar35 = 1.0 - fVar33;
            auVar21._0_4_ =
                 (((BBox3fa *)(pVVar9 + -1))->lower).field_0.m128[0] -
                 (fVar18 * fVar35 + fVar41 * fVar33);
            auVar21._4_4_ =
                 (((BBox3fa *)(pVVar9 + -1))->lower).field_0.m128[1] -
                 (fVar19 * fVar35 + fVar29 * fVar33);
            auVar21._8_4_ =
                 (((BBox3fa *)(pVVar9 + -1))->lower).field_0.m128[2] -
                 (fVar34 * fVar35 + fVar31 * fVar33);
            auVar21._12_4_ =
                 (((BBox3fa *)(pVVar9 + -1))->lower).field_0.m128[3] -
                 (fVar38 * fVar35 + fVar32 * fVar33);
            auVar30._0_4_ = (pVVar9->field_0).m128[0] - (fVar35 * fVar20 + fVar33 * fVar25);
            auVar30._4_4_ = (pVVar9->field_0).m128[1] - (fVar35 * fVar22 + fVar33 * fVar26);
            auVar30._8_4_ = (pVVar9->field_0).m128[2] - (fVar35 * fVar23 + fVar33 * fVar27);
            auVar30._12_4_ = (pVVar9->field_0).m128[3] - (fVar35 * fVar24 + fVar33 * fVar28);
            auVar21 = minps(auVar21,ZEXT816(0));
            auVar30 = maxps(auVar30,ZEXT816(0));
            fVar18 = fVar18 + auVar21._0_4_;
            fVar19 = fVar19 + auVar21._4_4_;
            fVar34 = fVar34 + auVar21._8_4_;
            fVar38 = fVar38 + auVar21._12_4_;
            fVar41 = fVar41 + auVar21._0_4_;
            fVar29 = fVar29 + auVar21._4_4_;
            fVar31 = fVar31 + auVar21._8_4_;
            fVar32 = fVar32 + auVar21._12_4_;
            fVar20 = fVar20 + auVar30._0_4_;
            fVar22 = fVar22 + auVar30._4_4_;
            fVar23 = fVar23 + auVar30._8_4_;
            fVar24 = fVar24 + auVar30._12_4_;
            fVar25 = fVar25 + auVar30._0_4_;
            fVar26 = fVar26 + auVar30._4_4_;
            fVar27 = fVar27 + auVar30._8_4_;
            fVar28 = fVar28 + auVar30._12_4_;
            pVVar9 = pVVar9 + 2;
          }
        }
        (__return_storage_ptr__->first).ptr = (ulong)pcVar17 | 6;
        (__return_storage_ptr__->second).bounds0.lower.field_0.m128[0] = fVar18;
        (__return_storage_ptr__->second).bounds0.lower.field_0.m128[1] = fVar19;
        (__return_storage_ptr__->second).bounds0.lower.field_0.m128[2] = fVar34;
        (__return_storage_ptr__->second).bounds0.lower.field_0.m128[3] = fVar38;
        (__return_storage_ptr__->second).bounds0.upper.field_0.m128[0] = fVar20;
        (__return_storage_ptr__->second).bounds0.upper.field_0.m128[1] = fVar22;
        (__return_storage_ptr__->second).bounds0.upper.field_0.m128[2] = fVar23;
        (__return_storage_ptr__->second).bounds0.upper.field_0.m128[3] = fVar24;
        (__return_storage_ptr__->second).bounds1.lower.field_0.m128[0] = fVar41;
        (__return_storage_ptr__->second).bounds1.lower.field_0.m128[1] = fVar29;
        (__return_storage_ptr__->second).bounds1.lower.field_0.m128[2] = fVar31;
        (__return_storage_ptr__->second).bounds1.lower.field_0.m128[3] = fVar32;
        (__return_storage_ptr__->second).bounds1.upper.field_0.m128[0] = fVar25;
        (__return_storage_ptr__->second).bounds1.upper.field_0.m128[1] = fVar26;
        (__return_storage_ptr__->second).bounds1.upper.field_0.m128[2] = fVar27;
        (__return_storage_ptr__->second).bounds1.upper.field_0.m128[3] = fVar28;
        return __return_storage_ptr__;
      }
      iVar6 = iVar5 / 4;
      iVar12 = iVar10 / 4;
      iVar10 = iVar10 + iVar15;
      iVar5 = iVar5 + iVar15;
    } while (iVar12 <= iVar6);
    iVar6 = iVar6 + iVar2;
    iVar12 = iVar12 + iVar2;
    local_a8._begin = iVar6;
    local_a8._end = iVar12;
    buildMSMBlurBVH((pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> *)&range,local_a0,
                    &local_a8,local_90,bounds_o);
    fVar19 = (float)(local_a0->time_steps - 1);
    fVar18 = (float)iVar6 / fVar19;
    fVar19 = (float)iVar12 / fVar19;
    fVar38 = 1.0 / (fVar19 - fVar18);
    fVar41 = -fVar18 * fVar38;
    fVar34 = 1.0 - fVar41;
    auVar37._0_4_ = local_78.m128[0] * fVar34 + local_58.m128[0] * fVar41;
    auVar37._4_4_ = local_78.m128[1] * fVar34 + local_58.m128[1] * fVar41;
    auVar37._8_4_ = local_78.m128[2] * fVar34 + local_58.m128[2] * fVar41;
    auVar37._12_4_ = local_78.m128[3] * fVar34 + local_58.m128[3] * fVar41;
    auVar36._0_4_ = fVar34 * local_68.m128[0] + fVar41 * local_48.m128[0];
    auVar36._4_4_ = fVar34 * local_68.m128[1] + fVar41 * local_48.m128[1];
    auVar36._8_4_ = fVar34 * local_68.m128[2] + fVar41 * local_48.m128[2];
    auVar36._12_4_ = fVar34 * local_68.m128[3] + fVar41 * local_48.m128[3];
    fVar38 = (1.0 - fVar18) * fVar38;
    fVar34 = 1.0 - fVar38;
    auVar40._0_4_ = local_78.m128[0] * fVar34 + local_58.m128[0] * fVar38;
    auVar40._4_4_ = local_78.m128[1] * fVar34 + local_58.m128[1] * fVar38;
    auVar40._8_4_ = local_78.m128[2] * fVar34 + local_58.m128[2] * fVar38;
    auVar40._12_4_ = local_78.m128[3] * fVar34 + local_58.m128[3] * fVar38;
    uVar8 = (ulong)local_b4;
    *(ulong *)(pcVar17 + uVar8 * 8) = CONCAT44(range.u_end,range.u_start);
    auVar39._0_4_ = fVar34 * local_68.m128[0] + fVar38 * local_48.m128[0];
    auVar39._4_4_ = fVar34 * local_68.m128[1] + fVar38 * local_48.m128[1];
    auVar39._8_4_ = fVar34 * local_68.m128[2] + fVar38 * local_48.m128[2];
    auVar39._12_4_ = fVar34 * local_68.m128[3] + fVar38 * local_48.m128[3];
    auVar30 = minps(auVar37,_DAT_01f4b860);
    auVar37 = maxps(auVar36,_DAT_01f4b850);
    auVar21 = minps(auVar40,_DAT_01f4b860);
    auVar40 = maxps(auVar39,_DAT_01f4b850);
    fVar29 = auVar30._0_4_ - ABS(auVar30._0_4_) * 4.7683716e-07;
    fVar31 = auVar30._4_4_ - ABS(auVar30._4_4_) * 4.7683716e-07;
    fVar32 = auVar30._8_4_ - ABS(auVar30._8_4_) * 4.7683716e-07;
    fVar34 = ABS(auVar37._0_4_) * 4.7683716e-07 + auVar37._0_4_;
    fVar38 = ABS(auVar37._4_4_) * 4.7683716e-07 + auVar37._4_4_;
    fVar41 = ABS(auVar37._8_4_) * 4.7683716e-07 + auVar37._8_4_;
    *(float *)(this[1].data + uVar8 * 4 + sVar13 + -0x18) = fVar29;
    *(float *)(this[2].data + uVar8 * 4 + sVar13 + -0x30) = fVar31;
    *(float *)(this[2].data + uVar8 * 4 + sVar13 + -0x10) = fVar32;
    *(float *)(this[1].data + uVar8 * 4 + sVar13 + -8) = fVar34;
    *(float *)(this[2].data + uVar8 * 4 + sVar13 + -0x20) = fVar38;
    *(float *)(this[2].data + uVar8 * 4 + sVar13) = fVar41;
    *(float *)(this[3].data + uVar8 * 4 + sVar13 + -0x28) =
         (auVar21._0_4_ - ABS(auVar21._0_4_) * 4.7683716e-07) - fVar29;
    *(float *)(this[3].data + uVar8 * 4 + sVar13 + -8) =
         (auVar21._4_4_ - ABS(auVar21._4_4_) * 4.7683716e-07) - fVar31;
    *(float *)(this[4].data + uVar8 * 4 + sVar13 + -0x20) =
         (auVar21._8_4_ - ABS(auVar21._8_4_) * 4.7683716e-07) - fVar32;
    *(float *)(this[3].data + uVar8 * 4 + sVar13 + -0x18) =
         (ABS(auVar40._0_4_) * 4.7683716e-07 + auVar40._0_4_) - fVar34;
    *(float *)(this[4].data + uVar8 * 4 + sVar13 + -0x30) =
         (ABS(auVar40._4_4_) * 4.7683716e-07 + auVar40._4_4_) - fVar38;
    *(float *)(this[4].data + uVar8 * 4 + sVar13 + -0x10) =
         (ABS(auVar40._8_4_) * 4.7683716e-07 + auVar40._8_4_) - fVar41;
    *(float *)(this[4].data + uVar8 * 4 + sVar13) = fVar18;
    *(uint *)(this[5].data + uVar8 * 4 + sVar13 + -0x28) =
         -(uint)(fVar19 == 1.0) & 0x3f800001 | ~-(uint)(fVar19 == 1.0) & (uint)fVar19;
    local_b4 = local_b4 + 1;
  } while( true );
}

Assistant:

std::pair<BVH4::NodeRef,LBBox3fa> GridSOA::buildMSMBlurBVH(const range<int> time_range, size_t& allocator, BBox3fa* bounds_o)
    {
      assert(time_range.size() > 0);
      if (time_range.size() == 1) 
      {
        size_t t = time_range.begin();
        GridRange range(0,width-1,0,height-1);
        std::pair<BVH4::NodeRef,LBBox3fa> root_bounds = buildMBlurBVH(t,range,allocator);
        root(t) = root_bounds.first;
        bounds_o[t+0] = root_bounds.second.bounds0;
        bounds_o[t+1] = root_bounds.second.bounds1;
        return root_bounds;
      }

      /* allocate new bvh4 node */
      BVH4::AABBNodeMB4D* node = (BVH4::AABBNodeMB4D*)&bvhData()[allocator];
      allocator += sizeof(BVH4::AABBNodeMB4D);
      node->clear();

      for (int i=0, j=0; i<4; i++) 
      {
        const int begin = time_range.begin() + (i+0)*time_range.size()/4;
        const int end   = time_range.begin() + (i+1)*time_range.size()/4;
        if (end-begin <= 0) continue;
        std::pair<BVH4::NodeRef,LBBox3fa> node_bounds = buildMSMBlurBVH(make_range(begin,end),allocator,bounds_o);
        const float t0 = float(begin)/float(time_steps-1);
        const float t1 = float(end  )/float(time_steps-1);
        BVH4::NodeRecordMB4D nodeRecord;
        nodeRecord.ref = node_bounds.first;
        nodeRecord.lbounds = node_bounds.second;
        nodeRecord.dt = BBox1f(t0, t1);
        node->set(j,nodeRecord);
        j++;
      }

      const LBBox3fa lbounds = LBBox3fa([&] ( int i ) { return bounds_o[i]; }, time_range, time_steps-1);
      return std::make_pair(BVH4::encodeNode(node),lbounds);
    }